

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_enc.c
# Opt level: O1

int WebPValidatePicture(WebPPicture *picture)

{
  int iVar1;
  
  if (picture == (WebPPicture *)0x0) {
    return 0;
  }
  if ((0 < picture->width) && (0 < picture->height)) {
    if ((picture->colorspace & ~WEBP_CSP_ALPHA_BIT) == WEBP_YUV420) {
      return 1;
    }
    iVar1 = WebPEncodingSetError(picture,VP8_ENC_ERROR_INVALID_CONFIGURATION);
    return iVar1;
  }
  if (picture->error_code == VP8_ENC_OK) {
    picture->error_code = VP8_ENC_ERROR_BAD_DIMENSION;
  }
  return 0;
}

Assistant:

int WebPValidatePicture(const WebPPicture* const picture) {
  if (picture == NULL) return 0;
  if (picture->width <= 0 || picture->height <= 0) {
    return WebPEncodingSetError(picture, VP8_ENC_ERROR_BAD_DIMENSION);
  }
  if (picture->width <= 0 || picture->width / 4 > INT_MAX / 4 ||
      picture->height <= 0 || picture->height / 4 > INT_MAX / 4) {
    return WebPEncodingSetError(picture, VP8_ENC_ERROR_BAD_DIMENSION);
  }
  if (picture->colorspace != WEBP_YUV420 &&
      picture->colorspace != WEBP_YUV420A) {
    return WebPEncodingSetError(picture, VP8_ENC_ERROR_INVALID_CONFIGURATION);
  }
  return 1;
}